

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

bool __thiscall TcpSocketImpl::GetConnectionInfo(TcpSocketImpl *this)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  allocator<char> local_219;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0 [8];
  string servInfoPeer;
  string local_1c8 [8];
  string caAddrPeer;
  string local_1a0;
  allocator<char> local_179;
  string local_178 [8];
  string servInfoClient;
  allocator<char> local_141;
  string local_140 [8];
  string caAddrClient;
  sockaddr_storage addrPe;
  undefined1 local_98 [4];
  socklen_t addLen;
  sockaddr_storage addrCl;
  TcpSocketImpl *this_local;
  
  addrPe.__ss_align._4_4_ = 0x80;
  addrCl.__ss_align = (unsigned_long)this;
  iVar1 = getpeername((this->super_BaseSocketImpl).m_fSock,(sockaddr *)local_98,
                      (socklen_t *)((long)&addrPe.__ss_align + 4));
  if (iVar1 == 0) {
    addrPe.__ss_align._4_4_ = 0x80;
    iVar1 = getsockname((this->super_BaseSocketImpl).m_fSock,
                        (sockaddr *)((long)&caAddrClient.field_2 + 8),
                        (socklen_t *)((long)&addrPe.__ss_align + 4));
    if (iVar1 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_140,0x2f,'\0',&local_141);
      std::allocator<char>::~allocator(&local_141);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_178,0x20,'\0',&local_179);
      std::allocator<char>::~allocator(&local_179);
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_140);
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_178);
      iVar1 = getnameinfo((sockaddr *)local_98,0x80,pcVar4,0x2e,pcVar5,0x20,3);
      if (iVar1 == 0) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_140);
        std::__cxx11::string::operator=((string *)&this->m_strClientAddr,pcVar4);
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_178);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a0,pcVar4,
                   (allocator<char> *)(caAddrPeer.field_2._M_local_buf + 0xf));
        iVar1 = std::__cxx11::stoi(&local_1a0,(size_t *)0x0,10);
        this->m_sClientPort = (uint16_t)iVar1;
        std::__cxx11::string::~string((string *)&local_1a0);
        std::allocator<char>::~allocator((allocator<char> *)(caAddrPeer.field_2._M_local_buf + 0xf))
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1c8,0x2f,'\0',(allocator<char> *)(servInfoPeer.field_2._M_local_buf + 0xf))
        ;
        std::allocator<char>::~allocator
                  ((allocator<char> *)(servInfoPeer.field_2._M_local_buf + 0xf));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_1f0,0x20,'\0',&local_1f1);
        std::allocator<char>::~allocator(&local_1f1);
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_1c8);
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_1f0);
        iVar1 = getnameinfo((sockaddr *)((long)&caAddrClient.field_2 + 8),0x80,pcVar4,0x2e,pcVar5,
                            0x20,3);
        if (iVar1 != 0) {
          piVar3 = __errno_location();
          (this->super_BaseSocketImpl).m_iError = *piVar3;
          (this->super_BaseSocketImpl).m_iErrLoc = 0xd;
        }
        else {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_1c8);
          std::__cxx11::string::operator=((string *)&this->m_strIFaceAddr,pcVar4);
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_1f0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,pcVar4,&local_219)
          ;
          iVar2 = std::__cxx11::stoi(&local_218,(size_t *)0x0,10);
          this->m_sIFacePort = (uint16_t)iVar2;
          std::__cxx11::string::~string((string *)&local_218);
          std::allocator<char>::~allocator(&local_219);
        }
        this_local._7_1_ = iVar1 == 0;
        caAddrPeer.field_2._8_4_ = 1;
        std::__cxx11::string::~string(local_1f0);
        std::__cxx11::string::~string(local_1c8);
      }
      else {
        piVar3 = __errno_location();
        (this->super_BaseSocketImpl).m_iError = *piVar3;
        (this->super_BaseSocketImpl).m_iErrLoc = 0xc;
        this_local._7_1_ = false;
        caAddrPeer.field_2._8_4_ = 1;
      }
      std::__cxx11::string::~string(local_178);
      std::__cxx11::string::~string(local_140);
    }
    else {
      piVar3 = __errno_location();
      (this->super_BaseSocketImpl).m_iError = *piVar3;
      (this->super_BaseSocketImpl).m_iErrLoc = 0xb;
      this_local._7_1_ = false;
    }
  }
  else {
    piVar3 = __errno_location();
    (this->super_BaseSocketImpl).m_iError = *piVar3;
    (this->super_BaseSocketImpl).m_iErrLoc = 10;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TcpSocketImpl::GetConnectionInfo()
{
    struct sockaddr_storage addrCl;
    socklen_t addLen = sizeof(addrCl);
    if (::getpeername(m_fSock, reinterpret_cast<struct sockaddr*>(&addrCl), &addLen) != 0)  // Get the IP to where the connection was established
    {
        m_iError = WSAGetLastError();
        m_iErrLoc = 10;
        return false;
    }

    struct sockaddr_storage addrPe;
    addLen = sizeof(addrPe);
    if (::getsockname(m_fSock, reinterpret_cast<struct sockaddr*>(&addrPe), &addLen) != 0)  // Get our IP where the connection was established
    {
        m_iError = WSAGetLastError();
        m_iErrLoc = 11;
        return false;
    }

    string caAddrClient(INET6_ADDRSTRLEN + 1, 0);
    string servInfoClient(NI_MAXSERV, 0);
    if (::getnameinfo(reinterpret_cast<struct sockaddr*>(&addrCl), sizeof(struct sockaddr_storage), &caAddrClient[0], INET6_ADDRSTRLEN, &servInfoClient[0], NI_MAXSERV, NI_NUMERICHOST | NI_NUMERICSERV) == 0)
    {
        m_strClientAddr = &caAddrClient[0];
        m_sClientPort = static_cast<uint16_t>(stoi(&servInfoClient[0]));
    }
    else
    {
        m_iError = WSAGetLastError();
        m_iErrLoc = 12;
        return false;
    }

    string caAddrPeer(INET6_ADDRSTRLEN + 1, 0);
    string servInfoPeer(NI_MAXSERV, 0);
    if (::getnameinfo(reinterpret_cast<struct sockaddr*>(&addrPe), sizeof(struct sockaddr_storage), &caAddrPeer[0], INET6_ADDRSTRLEN, &servInfoPeer[0], NI_MAXSERV, NI_NUMERICHOST | NI_NUMERICSERV) == 0)
    {
        m_strIFaceAddr = &caAddrPeer[0];
        m_sIFacePort = static_cast<uint16_t>(stoi(&servInfoPeer[0]));
    }
    else
    {
        m_iError = WSAGetLastError();
        m_iErrLoc = 13;
        return false;
    }

    return true;
}